

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O3

int units::order(unit *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  unit_data bd;
  int iVar11;
  
  iVar11 = (int)val;
  iVar2 = (iVar11 << 0x1c) >> 0x1c;
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  iVar3 = (iVar11 << 0xd) >> 0x1d;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  iVar4 = (iVar11 << 0x15) >> 0x1d;
  iVar3 = -iVar4;
  if (0 < iVar4) {
    iVar3 = iVar4;
  }
  iVar10 = (iVar11 << 4) >> 0x1e;
  iVar4 = -iVar10;
  if (0 < iVar10) {
    iVar4 = iVar10;
  }
  iVar7 = (iVar11 << 0x12) >> 0x1d;
  iVar10 = -iVar7;
  if (0 < iVar7) {
    iVar10 = iVar7;
  }
  iVar8 = (int)(char)val >> 4;
  iVar7 = -iVar8;
  if (0 < iVar8) {
    iVar7 = iVar8;
  }
  iVar9 = (iVar11 << 6) >> 0x1e;
  iVar8 = -iVar9;
  if (0 < iVar9) {
    iVar8 = iVar9;
  }
  iVar5 = (iVar11 << 8) >> 0x1d;
  iVar9 = -iVar5;
  if (0 < iVar5) {
    iVar9 = iVar5;
  }
  iVar6 = (int)(short)val >> 0xe;
  iVar5 = -iVar6;
  if (0 < iVar6) {
    iVar5 = iVar6;
  }
  iVar6 = (iVar11 << 0xb) >> 0x1e;
  iVar11 = -iVar6;
  if (0 < iVar6) {
    iVar11 = iVar6;
  }
  return iVar11 + iVar5 + iVar9 + iVar8 + iVar7 + iVar10 + iVar4 + iVar3 + iVar2 + iVar1;
}

Assistant:

constexpr int meter() const { return meter_; }